

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Msg(Map *this,Character *from,string *message,bool echo)

{
  World *pWVar1;
  Character *other;
  bool bVar2;
  int iVar3;
  int iVar4;
  mapped_type *this_00;
  undefined7 in_register_00000009;
  _List_node_base *p_Var5;
  allocator<char> local_176;
  allocator<char> local_175;
  undefined4 local_174;
  string *local_170;
  _List_node_base *local_168;
  PacketBuilder builder;
  key_type local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_174 = (undefined4)CONCAT71(in_register_00000009,echo);
  pWVar1 = this->world;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"ChatMaxWidth",&local_175)
  ;
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,&local_130);
  iVar3 = util::variant::GetInt(this_00);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_f0,from);
  util::ucfirst(&local_d0,&local_f0);
  std::operator+(&local_b0,&local_d0,"  ");
  iVar4 = util::text_width(&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"...",&local_176);
  util::text_cap((string *)&builder,message,iVar3 - iVar4,&local_110);
  std::__cxx11::string::operator=((string *)message,(string *)&builder);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_130);
  PacketBuilder::PacketBuilder(&builder,PACKET_TALK,PACKET_PLAYER,message->_M_string_length + 2);
  iVar3 = Character::PlayerID(from);
  PacketBuilder::AddShort(&builder,iVar3);
  PacketBuilder::AddString(&builder,message);
  p_Var5 = (_List_node_base *)&this->characters;
  local_170 = message;
  local_168 = p_Var5;
  while (p_Var5 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var5->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var5 != local_168) {
    other = (Character *)p_Var5[1]._M_next;
    bVar2 = Character::InRange(from,other);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"",(allocator<char> *)&local_130);
      (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_90,from);
      std::__cxx11::string::string((string *)&local_50,(string *)local_170);
      Character::AddChatLog(other,&local_70,&local_90,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      if (other != from || (char)local_174 != '\0') {
        Character::Send(other,&builder);
      }
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Map::Msg(Character *from, std::string message, bool echo)
{
	message = util::text_cap(message, static_cast<int>(this->world->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  "));

	PacketBuilder builder(PACKET_TALK, PACKET_PLAYER, 2 + message.length());
	builder.AddShort(from->PlayerID());
	builder.AddString(message);

	UTIL_FOREACH(this->characters, character)
	{
		if (!from->InRange(character))
			continue;

		character->AddChatLog("", from->SourceName(), message);

		if (!echo && character == from)
			continue;

		character->Send(builder);
	}
}